

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

DecodeResult * bech32::Decode(DecodeResult *__return_storage_ptr__,string *str,CharLimit limit)

{
  char cVar1;
  long lVar2;
  CharLimit CVar3;
  Encoding enc_00;
  bool bVar4;
  uint32_t uVar5;
  size_type __res;
  ulong uVar6;
  char __c;
  size_t i;
  size_type sVar7;
  long in_FS_OFFSET;
  allocator_type local_a1;
  data values;
  vector<int,_std::allocator<int>_> errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> enc;
  string hrp;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar4 = anon_unknown_0::CheckCharacters(str,&errors);
  if (bVar4) {
    __res = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (str,'1',0xffffffffffffffff);
    CVar3 = str->_M_string_length;
    if ((CVar3 <= limit) && (__res - 1 < 0xfffffffffffffffe && __res + 6 < CVar3)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&values,CVar3 + ~__res,(allocator_type *)&hrp);
      for (uVar6 = 0; uVar6 < str->_M_string_length + ~__res; uVar6 = uVar6 + 1) {
        if ((anonymous_namespace)::CHARSET_REV[(byte)(str->_M_dataplus)._M_p[uVar6 + 1 + __res]] ==
            0xff) {
          __return_storage_ptr__->encoding = INVALID;
          (__return_storage_ptr__->hrp)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->hrp).field_2;
          (__return_storage_ptr__->hrp)._M_string_length = 0;
          (__return_storage_ptr__->hrp).field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->data).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->data).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->data).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          goto LAB_00a5147d;
        }
        values.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] =
             (anonymous_namespace)::CHARSET_REV[(byte)(str->_M_dataplus)._M_p[uVar6 + 1 + __res]];
      }
      hrp._M_dataplus._M_p = (pointer)&hrp.field_2;
      hrp._M_string_length = 0;
      hrp.field_2._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (&hrp,__res);
      for (sVar7 = 0; __res != sVar7; sVar7 = sVar7 + 1) {
        cVar1 = (str->_M_dataplus)._M_p[sVar7];
        __c = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          __c = cVar1;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&hrp,__c);
      }
      anon_unknown_0::PreparePolynomialCoefficients(&enc,&hrp,&values);
      uVar5 = anon_unknown_0::PolyMod
                        ((data *)&enc.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
      ;
      enc_00 = (uint)(uVar5 == 0x2bc830a3) * 2;
      if (uVar5 == 1) {
        enc_00 = BECH32;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (enc_00 == INVALID) {
        __return_storage_ptr__->encoding = INVALID;
        (__return_storage_ptr__->hrp)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->hrp).field_2;
        (__return_storage_ptr__->hrp)._M_string_length = 0;
        (__return_storage_ptr__->hrp).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->data).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->data).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->data).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&enc,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )values.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(values.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish + -6),&local_a1);
        DecodeResult::DecodeResult
                  (__return_storage_ptr__,enc_00,&hrp,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      std::__cxx11::string::~string((string *)&hrp);
LAB_00a5147d:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&values.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      goto LAB_00a51331;
    }
  }
  __return_storage_ptr__->encoding = INVALID;
  (__return_storage_ptr__->hrp)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hrp).field_2;
  (__return_storage_ptr__->hrp)._M_string_length = 0;
  (__return_storage_ptr__->hrp).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00a51331:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&errors.super__Vector_base<int,_std::allocator<int>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

DecodeResult Decode(const std::string& str, CharLimit limit) {
    std::vector<int> errors;
    if (!CheckCharacters(str, errors)) return {};
    size_t pos = str.rfind('1');
    if (str.size() > limit) return {};
    if (pos == str.npos || pos == 0 || pos + CHECKSUM_SIZE >= str.size()) {
        return {};
    }
    data values(str.size() - 1 - pos);
    for (size_t i = 0; i < str.size() - 1 - pos; ++i) {
        unsigned char c = str[i + pos + 1];
        int8_t rev = CHARSET_REV[c];

        if (rev == -1) {
            return {};
        }
        values[i] = rev;
    }
    std::string hrp;
    hrp.reserve(pos);
    for (size_t i = 0; i < pos; ++i) {
        hrp += LowerCase(str[i]);
    }
    Encoding result = VerifyChecksum(hrp, values);
    if (result == Encoding::INVALID) return {};
    return {result, std::move(hrp), data(values.begin(), values.end() - CHECKSUM_SIZE)};
}